

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_pcm_deinterleave_s24(void **dst,void *src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  void *src_local;
  void **dst_local;
  uint local_40;
  uint local_3c;
  ma_uint32 iChannel;
  ma_uint32 iFrame;
  ma_uint8 *src8;
  ma_uint8 **dst8;
  
  for (local_3c = 0; local_3c < frameCount; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < channels; local_40 = local_40 + 1) {
      *(undefined1 *)((long)dst[local_40] + (ulong)(local_3c * 3)) =
           *(undefined1 *)((long)src + (ulong)(local_3c * 3 * channels + local_40 * 3));
      *(undefined1 *)((long)dst[local_40] + (ulong)(local_3c * 3 + 1)) =
           *(undefined1 *)((long)src + (ulong)(local_3c * 3 * channels + local_40 * 3 + 1));
      *(undefined1 *)((long)dst[local_40] + (ulong)(local_3c * 3 + 2)) =
           *(undefined1 *)((long)src + (ulong)(local_3c * 3 * channels + local_40 * 3 + 2));
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_deinterleave_s24(void** dst, const void* src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_deinterleave_s24__reference(dst, src, frameCount, channels);
#else
    ma_pcm_deinterleave_s24__optimized(dst, src, frameCount, channels);
#endif
}